

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::PipelineLayout::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  deInt32 *pdVar1;
  pointer *ppSVar2;
  pointer pSVar3;
  pointer pSVar4;
  SharedPtrStateBase *pSVar5;
  iterator __position;
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *this_00;
  SharedPtrStateBase *pSVar6;
  ulong uVar7;
  pointer pSVar8;
  pointer pSVar9;
  Unique<vk::Handle<(vk::HandleType)19>_> *__args;
  ulong uVar10;
  pointer params_00;
  ulong uVar11;
  pointer pSVar12;
  pointer pSVar13;
  
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pSetLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->descriptorSetLayouts).
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params_00 = (params->descriptorSetLayouts).
              super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (params_00 !=
      (params->descriptorSetLayouts).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
                operator_new(0x60);
      Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
                (this_00,env,params_00);
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cee218;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSVar3 = (this->descriptorSetLayouts).
               super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar3 == (this->descriptorSetLayouts).
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pSVar4 = (this->descriptorSetLayouts).
                 super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pSVar3 - (long)pSVar4 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar11 = (long)pSVar3 - (long)pSVar4 >> 4;
        uVar7 = uVar11;
        if (pSVar3 == pSVar4) {
          uVar7 = 1;
        }
        uVar10 = uVar7 + uVar11;
        if (0x7fffffffffffffe < uVar10) {
          uVar10 = 0x7ffffffffffffff;
        }
        if (CARRY8(uVar7,uVar11)) {
          uVar10 = 0x7ffffffffffffff;
        }
        if (uVar10 == 0) {
          pSVar8 = (pointer)0x0;
        }
        else {
          pSVar8 = (pointer)operator_new(uVar10 << 4);
        }
        pSVar8[uVar11].m_ptr = this_00;
        pSVar8[uVar11].m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &(pSVar8[uVar11].m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        if (pSVar3 == pSVar4) {
          pSVar13 = pSVar8 + 1;
        }
        else {
          pSVar13 = pSVar8 + 1;
          pSVar9 = pSVar4;
          do {
            pSVar5 = pSVar9->m_state;
            pSVar13[-1].m_ptr = pSVar9->m_ptr;
            pSVar13[-1].m_state = pSVar5;
            if (pSVar5 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
              UNLOCK();
              LOCK();
              pdVar1 = &(pSVar13[-1].m_state)->weakRefCount;
              *pdVar1 = *pdVar1 + 1;
              UNLOCK();
            }
            pSVar9 = pSVar9 + 1;
            pSVar13 = pSVar13 + 1;
            pSVar12 = pSVar4;
          } while (pSVar9 != pSVar3);
          do {
            if (pSVar12->m_state != (SharedPtrStateBase *)0x0) {
              LOCK();
              pdVar1 = &pSVar12->m_state->strongRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                pSVar12->m_ptr =
                     (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)0x0;
                (*pSVar12->m_state->_vptr_SharedPtrStateBase[2])();
              }
              LOCK();
              pdVar1 = &pSVar12->m_state->weakRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                if (pSVar12->m_state != (SharedPtrStateBase *)0x0) {
                  (*pSVar12->m_state->_vptr_SharedPtrStateBase[1])();
                }
                pSVar12->m_state = (SharedPtrStateBase *)0x0;
              }
            }
            pSVar12 = pSVar12 + 1;
          } while (pSVar12 != pSVar3);
        }
        if (pSVar4 != (pointer)0x0) {
          operator_delete(pSVar4,(long)(this->descriptorSetLayouts).
                                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pSVar4);
        }
        (this->descriptorSetLayouts).
        super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pSVar8;
        (this->descriptorSetLayouts).
        super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
        (this->descriptorSetLayouts).
        super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar8 + uVar10;
      }
      else {
        pSVar3->m_ptr = this_00;
        pSVar3->m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &pSVar3->m_state->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        ppSVar2 = &(this->descriptorSetLayouts).
                   super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar6->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
        }
        LOCK();
        pdVar1 = &pSVar6->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (pSVar6 != (SharedPtrStateBase *)0x0)) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
      }
      __position._M_current =
           (this->pSetLayouts).
           super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      __args = &((this->descriptorSetLayouts).
                 super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->object;
      if (__position._M_current ==
          (this->pSetLayouts).
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::Handle<(vk::HandleType)19>,std::allocator<vk::Handle<(vk::HandleType)19>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)19>const&>
                  ((vector<vk::Handle<(vk::HandleType)19>,std::allocator<vk::Handle<(vk::HandleType)19>>>
                    *)&this->pSetLayouts,__position,(Handle<(vk::HandleType)19> *)__args);
      }
      else {
        (__position._M_current)->m_internal =
             (__args->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
        (this->pSetLayouts).
        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      params_00 = params_00 + 1;
    } while (params_00 !=
             (params->descriptorSetLayouts).
             super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
		{
			for (vector<DescriptorSetLayout::Parameters>::const_iterator dsParams = params.descriptorSetLayouts.begin();
				 dsParams != params.descriptorSetLayouts.end();
				 ++dsParams)
			{
				descriptorSetLayouts.push_back(DescriptorSetLayoutDepSp(new Dependency<DescriptorSetLayout>(env, *dsParams)));
				pSetLayouts.push_back(*descriptorSetLayouts.back()->object);
			}
		}